

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::BVHNIntersector1<8,_16781328,_false,_embree::avx512::VirtualCurveIntersector1>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  bool bVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  long lVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [12];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  char cVar22;
  AABBNodeMB4D *node1;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  ulong uVar26;
  ulong *puVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar62 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [16];
  float fVar66;
  undefined1 auVar67 [16];
  float fVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [64];
  vfloat4 a0;
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  Precalculations pre;
  NodeRef stack [564];
  float local_1218 [4];
  undefined1 local_1208 [16];
  undefined1 local_11f8 [16];
  undefined1 local_11e8 [16];
  ulong local_11d8;
  ulong local_11d0 [564];
  int iVar31;
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  undefined1 auVar63 [32];
  
  local_11d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8 != 8) {
    if (0.0 <= ray->tfar) {
      aVar6 = (ray->dir).field_0.field_1;
      auVar36 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
      auVar17 = ZEXT812(0) << 0x20;
      auVar67 = ZEXT816(0) << 0x40;
      auVar69._4_12_ = auVar17;
      auVar69._0_4_ = auVar36._0_4_;
      auVar32 = vrsqrt14ss_avx512f(auVar67,auVar69);
      fVar68 = auVar32._0_4_;
      uVar1 = *(undefined4 *)&(ray->dir).field_0;
      local_1218[0] = fVar68 * 1.5 - auVar36._0_4_ * 0.5 * fVar68 * fVar68 * fVar68;
      uVar2 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
      fVar68 = (ray->dir).field_0.m128[2];
      auVar75._0_4_ = aVar6.x * local_1218[0];
      auVar75._4_4_ = aVar6.y * local_1218[0];
      auVar75._8_4_ = aVar6.z * local_1218[0];
      auVar75._12_4_ = aVar6.field_3.w * local_1218[0];
      auVar32 = vshufpd_avx(auVar75,auVar75,1);
      auVar36 = vmovshdup_avx(auVar75);
      auVar65._8_4_ = 0x80000000;
      auVar65._0_8_ = 0x8000000080000000;
      auVar65._12_4_ = 0x80000000;
      auVar46._16_4_ = 0x80000000;
      auVar46._0_16_ = auVar65;
      auVar46._20_4_ = 0x80000000;
      auVar46._24_4_ = 0x80000000;
      auVar46._28_4_ = 0x80000000;
      auVar81._0_4_ = auVar36._0_4_ ^ 0x80000000;
      auVar36 = vunpckhps_avx(auVar75,auVar67);
      auVar81._4_12_ = auVar17;
      auVar35 = vshufps_avx(auVar36,auVar81,0x41);
      auVar79._0_8_ = auVar32._0_8_ ^ 0x8000000080000000;
      auVar79._8_8_ = auVar32._8_8_ ^ auVar65._8_8_;
      auVar34 = vinsertps_avx(auVar79,auVar75,0x2a);
      auVar36 = vdpps_avx(auVar35,auVar35,0x7f);
      auVar32 = vdpps_avx(auVar34,auVar34,0x7f);
      uVar10 = vcmpps_avx512vl(auVar32,auVar36,1);
      auVar36 = vpmovm2d_avx512vl(uVar10);
      auVar82._0_4_ = auVar36._0_4_;
      auVar82._4_4_ = auVar82._0_4_;
      auVar82._8_4_ = auVar82._0_4_;
      auVar82._12_4_ = auVar82._0_4_;
      uVar30 = vpmovd2m_avx512vl(auVar82);
      auVar36 = vpcmpeqd_avx(auVar82,auVar82);
      auVar33._4_4_ = (uint)((byte)(uVar30 >> 1) & 1) * auVar36._4_4_;
      auVar33._0_4_ = (uint)((byte)uVar30 & 1) * auVar36._0_4_;
      auVar33._8_4_ = (uint)((byte)(uVar30 >> 2) & 1) * auVar36._8_4_;
      auVar33._12_4_ = (uint)((byte)(uVar30 >> 3) & 1) * auVar36._12_4_;
      auVar36 = vblendvps_avx(auVar34,auVar35,auVar33);
      auVar32 = vdpps_avx(auVar36,auVar36,0x7f);
      auVar83._4_12_ = auVar17;
      auVar83._0_4_ = auVar32._0_4_;
      auVar34 = vrsqrt14ss_avx512f(auVar67,auVar83);
      fVar66 = auVar34._0_4_;
      fVar66 = fVar66 * 1.5 - auVar32._0_4_ * 0.5 * fVar66 * fVar66 * fVar66;
      auVar80._0_4_ = auVar36._0_4_ * fVar66;
      auVar80._4_4_ = auVar36._4_4_ * fVar66;
      auVar80._8_4_ = auVar36._8_4_ * fVar66;
      auVar80._12_4_ = auVar36._12_4_ * fVar66;
      auVar36 = vshufps_avx(auVar80,auVar80,0xc9);
      auVar32 = vshufps_avx(auVar75,auVar75,0xc9);
      auVar84._0_4_ = auVar80._0_4_ * auVar32._0_4_;
      auVar84._4_4_ = auVar80._4_4_ * auVar32._4_4_;
      auVar84._8_4_ = auVar80._8_4_ * auVar32._8_4_;
      auVar84._12_4_ = auVar80._12_4_ * auVar32._12_4_;
      auVar36 = vfmsub231ps_fma(auVar84,auVar75,auVar36);
      auVar32 = vshufps_avx(auVar36,auVar36,0xc9);
      auVar36 = vdpps_avx(auVar32,auVar32,0x7f);
      auVar85._4_12_ = auVar17;
      auVar85._0_4_ = auVar36._0_4_;
      auVar34 = vrsqrt14ss_avx512f(auVar67,auVar85);
      fVar66 = auVar34._0_4_;
      fVar66 = fVar66 * 1.5 - auVar36._0_4_ * 0.5 * fVar66 * fVar66 * fVar66;
      auVar73._0_4_ = auVar32._0_4_ * fVar66;
      auVar73._4_4_ = auVar32._4_4_ * fVar66;
      auVar73._8_4_ = auVar32._8_4_ * fVar66;
      auVar73._12_4_ = auVar32._12_4_ * fVar66;
      auVar36._0_4_ = local_1218[0] * auVar75._0_4_;
      auVar36._4_4_ = local_1218[0] * auVar75._4_4_;
      auVar36._8_4_ = local_1218[0] * auVar75._8_4_;
      auVar36._12_4_ = local_1218[0] * auVar75._12_4_;
      auVar34 = vunpcklps_avx(auVar80,auVar36);
      auVar36 = vunpckhps_avx(auVar80,auVar36);
      auVar35 = vunpcklps_avx(auVar73,auVar67);
      auVar32 = vunpckhps_avx(auVar73,auVar67);
      local_11e8 = vunpcklps_avx(auVar36,auVar32);
      local_1208 = vunpcklps_avx(auVar34,auVar35);
      local_11f8 = vunpckhps_avx(auVar34,auVar35);
      auVar36 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar32._8_4_ = 0x7fffffff;
      auVar32._0_8_ = 0x7fffffff7fffffff;
      auVar32._12_4_ = 0x7fffffff;
      auVar32 = vandps_avx512vl((undefined1  [16])aVar6,auVar32);
      auVar67._8_4_ = 0x219392ef;
      auVar67._0_8_ = 0x219392ef219392ef;
      auVar67._12_4_ = 0x219392ef;
      puVar27 = local_11d0;
      uVar30 = vcmpps_avx512vl(auVar32,auVar67,1);
      bVar9 = (bool)((byte)uVar30 & 1);
      auVar35._0_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * (int)aVar6.x;
      bVar9 = (bool)((byte)(uVar30 >> 1) & 1);
      auVar35._4_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * (int)aVar6.y;
      bVar9 = (bool)((byte)(uVar30 >> 2) & 1);
      auVar35._8_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * (int)aVar6.z;
      bVar9 = (bool)((byte)(uVar30 >> 3) & 1);
      auVar35._12_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * aVar6.field_3.a;
      auVar32 = vrcp14ps_avx512vl(auVar35);
      auVar34._8_4_ = 0x3f800000;
      auVar34._0_8_ = 0x3f8000003f800000;
      auVar34._12_4_ = 0x3f800000;
      auVar34 = vfnmadd213ps_avx512vl(auVar35,auVar32,auVar34);
      auVar35 = vfmadd132ps_fma(auVar34,auVar32,auVar32);
      uVar3 = *(undefined4 *)&(ray->org).field_0;
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      uVar5 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      auVar37 = vbroadcastss_avx512vl(auVar35);
      auVar32 = vmovshdup_avx(auVar35);
      auVar38 = vbroadcastsd_avx512vl(auVar32);
      auVar34 = vshufpd_avx(auVar35,auVar35,1);
      auVar74 = ZEXT1664(auVar34);
      auVar40._8_4_ = 2;
      auVar40._0_8_ = 0x200000002;
      auVar40._12_4_ = 2;
      auVar40._16_4_ = 2;
      auVar40._20_4_ = 2;
      auVar40._24_4_ = 2;
      auVar40._28_4_ = 2;
      auVar39 = vpermps_avx512vl(auVar40,ZEXT1632(auVar35));
      fVar66 = auVar35._0_4_ * (ray->org).field_0.m128[0];
      auVar42._4_4_ = fVar66;
      auVar42._0_4_ = fVar66;
      auVar42._8_4_ = fVar66;
      auVar42._12_4_ = fVar66;
      auVar42._16_4_ = fVar66;
      auVar42._20_4_ = fVar66;
      auVar42._24_4_ = fVar66;
      auVar42._28_4_ = fVar66;
      auVar77 = ZEXT3264(auVar42);
      auVar43._8_4_ = 1;
      auVar43._0_8_ = 0x100000001;
      auVar43._12_4_ = 1;
      auVar43._16_4_ = 1;
      auVar43._20_4_ = 1;
      auVar43._24_4_ = 1;
      auVar43._28_4_ = 1;
      auVar44 = ZEXT1632(CONCAT412(auVar35._12_4_ * (ray->org).field_0.m128[3],
                                   CONCAT48(auVar35._8_4_ * (ray->org).field_0.m128[2],
                                            CONCAT44(auVar35._4_4_ * (ray->org).field_0.m128[1],
                                                     fVar66))));
      auVar43 = vpermps_avx2(auVar43,auVar44);
      auVar44 = vpermps_avx2(auVar40,auVar44);
      uVar29 = (ulong)(auVar35._0_4_ < 0.0) * 0x20;
      uVar30 = (ulong)(auVar32._0_4_ < 0.0) << 5 | 0x40;
      uVar28 = (ulong)(auVar34._0_4_ < 0.0) << 5 | 0x80;
      auVar40 = vbroadcastss_avx512vl(auVar36);
      auVar41 = vbroadcastss_avx512vl(ZEXT416((uint)ray->tfar));
      auVar42 = vxorps_avx512vl(auVar42,auVar46);
      auVar43 = vxorps_avx512vl(auVar43,auVar46);
      auVar44 = vxorps_avx512vl(auVar44,auVar46);
LAB_01c53eb2:
      if (puVar27 != &local_11d8) {
        uVar24 = puVar27[-1];
        puVar27 = puVar27 + -1;
        do {
          fVar66 = (ray->dir).field_0.m128[3];
          auVar62._4_4_ = fVar66;
          auVar62._0_4_ = fVar66;
          auVar62._8_4_ = fVar66;
          auVar62._12_4_ = fVar66;
          auVar63._16_4_ = fVar66;
          auVar63._0_16_ = auVar62;
          auVar63._20_4_ = fVar66;
          auVar63._24_4_ = fVar66;
          auVar63._28_4_ = fVar66;
          auVar36 = vsubss_avx512f(SUB6416(ZEXT464(0x3f800000),0),auVar62);
          auVar64._0_4_ = auVar36._0_4_;
          auVar64._4_4_ = auVar64._0_4_;
          auVar64._8_4_ = auVar64._0_4_;
          auVar64._12_4_ = auVar64._0_4_;
          auVar64._16_4_ = auVar64._0_4_;
          auVar64._20_4_ = auVar64._0_4_;
          auVar64._24_4_ = auVar64._0_4_;
          auVar64._28_4_ = auVar64._0_4_;
          do {
            if ((uVar24 & 8) != 0) {
              auVar74 = ZEXT1664(auVar74._0_16_);
              auVar77 = ZEXT1664(auVar77._0_16_);
              cVar22 = (**(code **)((long)This->leafIntersector +
                                   (ulong)*(byte *)(uVar24 & 0xfffffffffffffff0) * 0x40 + 8))
                                 (local_1218,ray,context);
              if (cVar22 != '\0') {
                ray->tfar = -INFINITY;
                return;
              }
              goto LAB_01c53eb2;
            }
            uVar25 = (uint)uVar24 & 7;
            uVar23 = uVar24 & 0xfffffffffffffff0;
            if (uVar25 == 3) {
              auVar46 = *(undefined1 (*) [32])(uVar23 + 0x60);
              auVar47 = *(undefined1 (*) [32])(uVar23 + 0x80);
              auVar45 = *(undefined1 (*) [32])(uVar23 + 0xa0);
              auVar48 = *(undefined1 (*) [32])(uVar23 + 0xe0);
              auVar49 = *(undefined1 (*) [32])(uVar23 + 0x100);
              auVar7 = *(undefined1 (*) [32])(uVar23 + 0x120);
              auVar8 = *(undefined1 (*) [32])(uVar23 + 0x140);
              auVar78._0_4_ = fVar68 * auVar49._0_4_;
              auVar78._4_4_ = fVar68 * auVar49._4_4_;
              auVar78._8_4_ = fVar68 * auVar49._8_4_;
              auVar78._12_4_ = fVar68 * auVar49._12_4_;
              auVar78._16_4_ = fVar68 * auVar49._16_4_;
              auVar78._20_4_ = fVar68 * auVar49._20_4_;
              auVar78._28_36_ = auVar77._28_36_;
              auVar78._24_4_ = fVar68 * auVar49._24_4_;
              auVar77._0_4_ = fVar68 * auVar7._0_4_;
              auVar77._4_4_ = fVar68 * auVar7._4_4_;
              auVar77._8_4_ = fVar68 * auVar7._8_4_;
              auVar77._12_4_ = fVar68 * auVar7._12_4_;
              auVar77._16_4_ = fVar68 * auVar7._16_4_;
              auVar77._20_4_ = fVar68 * auVar7._20_4_;
              auVar77._28_36_ = auVar74._28_36_;
              auVar77._24_4_ = fVar68 * auVar7._24_4_;
              auVar54._4_4_ = fVar68 * auVar8._4_4_;
              auVar54._0_4_ = fVar68 * auVar8._0_4_;
              auVar54._8_4_ = fVar68 * auVar8._8_4_;
              auVar54._12_4_ = fVar68 * auVar8._12_4_;
              auVar54._16_4_ = fVar68 * auVar8._16_4_;
              auVar54._20_4_ = fVar68 * auVar8._20_4_;
              auVar54._24_4_ = fVar68 * auVar8._24_4_;
              auVar54._28_4_ = fVar68;
              auVar20._4_4_ = uVar2;
              auVar20._0_4_ = uVar2;
              auVar20._8_4_ = uVar2;
              auVar20._12_4_ = uVar2;
              auVar20._16_4_ = uVar2;
              auVar20._20_4_ = uVar2;
              auVar20._24_4_ = uVar2;
              auVar20._28_4_ = uVar2;
              auVar36 = vfmadd231ps_fma(auVar78._0_32_,auVar20,auVar45);
              auVar32 = vfmadd231ps_fma(auVar77._0_32_,auVar20,*(undefined1 (*) [32])(uVar23 + 0xc0)
                                       );
              auVar34 = vfmadd231ps_fma(auVar54,auVar20,auVar48);
              auVar21._4_4_ = uVar1;
              auVar21._0_4_ = uVar1;
              auVar21._8_4_ = uVar1;
              auVar21._12_4_ = uVar1;
              auVar21._16_4_ = uVar1;
              auVar21._20_4_ = uVar1;
              auVar21._24_4_ = uVar1;
              auVar21._28_4_ = uVar1;
              auVar36 = vfmadd231ps_fma(ZEXT1632(auVar36),auVar21,
                                        *(undefined1 (*) [32])(uVar23 + 0x40));
              auVar32 = vfmadd231ps_fma(ZEXT1632(auVar32),auVar21,auVar46);
              auVar34 = vfmadd231ps_fma(ZEXT1632(auVar34),auVar21,auVar47);
              auVar86._8_4_ = 0x7fffffff;
              auVar86._0_8_ = 0x7fffffff7fffffff;
              auVar86._12_4_ = 0x7fffffff;
              auVar86._16_4_ = 0x7fffffff;
              auVar86._20_4_ = 0x7fffffff;
              auVar86._24_4_ = 0x7fffffff;
              auVar86._28_4_ = 0x7fffffff;
              auVar54 = vandps_avx(ZEXT1632(auVar36),auVar86);
              auVar50 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
              uVar24 = vcmpps_avx512vl(auVar54,auVar50,1);
              bVar9 = (bool)((byte)uVar24 & 1);
              iVar31 = auVar50._0_4_;
              auVar51._0_4_ = (uint)bVar9 * iVar31 | (uint)!bVar9 * auVar36._0_4_;
              bVar9 = (bool)((byte)(uVar24 >> 1) & 1);
              iVar55 = auVar50._4_4_;
              auVar51._4_4_ = (uint)bVar9 * iVar55 | (uint)!bVar9 * auVar36._4_4_;
              bVar9 = (bool)((byte)(uVar24 >> 2) & 1);
              iVar56 = auVar50._8_4_;
              auVar51._8_4_ = (uint)bVar9 * iVar56 | (uint)!bVar9 * auVar36._8_4_;
              bVar9 = (bool)((byte)(uVar24 >> 3) & 1);
              iVar57 = auVar50._12_4_;
              auVar51._12_4_ = (uint)bVar9 * iVar57 | (uint)!bVar9 * auVar36._12_4_;
              iVar58 = auVar50._16_4_;
              auVar51._16_4_ = (uint)((byte)(uVar24 >> 4) & 1) * iVar58;
              iVar59 = auVar50._20_4_;
              auVar51._20_4_ = (uint)((byte)(uVar24 >> 5) & 1) * iVar59;
              iVar60 = auVar50._24_4_;
              iVar61 = auVar50._28_4_;
              auVar51._24_4_ = (uint)((byte)(uVar24 >> 6) & 1) * iVar60;
              auVar51._28_4_ = (uint)(byte)(uVar24 >> 7) * iVar61;
              auVar54 = vandps_avx(auVar86,ZEXT1632(auVar32));
              uVar24 = vcmpps_avx512vl(auVar54,auVar50,1);
              bVar9 = (bool)((byte)uVar24 & 1);
              auVar52._0_4_ = (uint)bVar9 * iVar31 | (uint)!bVar9 * auVar32._0_4_;
              bVar9 = (bool)((byte)(uVar24 >> 1) & 1);
              auVar52._4_4_ = (uint)bVar9 * iVar55 | (uint)!bVar9 * auVar32._4_4_;
              bVar9 = (bool)((byte)(uVar24 >> 2) & 1);
              auVar52._8_4_ = (uint)bVar9 * iVar56 | (uint)!bVar9 * auVar32._8_4_;
              bVar9 = (bool)((byte)(uVar24 >> 3) & 1);
              auVar52._12_4_ = (uint)bVar9 * iVar57 | (uint)!bVar9 * auVar32._12_4_;
              auVar52._16_4_ = (uint)((byte)(uVar24 >> 4) & 1) * iVar58;
              auVar52._20_4_ = (uint)((byte)(uVar24 >> 5) & 1) * iVar59;
              auVar52._24_4_ = (uint)((byte)(uVar24 >> 6) & 1) * iVar60;
              auVar52._28_4_ = (uint)(byte)(uVar24 >> 7) * iVar61;
              auVar54 = vandps_avx(auVar86,ZEXT1632(auVar34));
              uVar24 = vcmpps_avx512vl(auVar54,auVar50,1);
              bVar9 = (bool)((byte)uVar24 & 1);
              auVar53._0_4_ = (uint)bVar9 * iVar31 | (uint)!bVar9 * auVar34._0_4_;
              bVar9 = (bool)((byte)(uVar24 >> 1) & 1);
              auVar53._4_4_ = (uint)bVar9 * iVar55 | (uint)!bVar9 * auVar34._4_4_;
              bVar9 = (bool)((byte)(uVar24 >> 2) & 1);
              auVar53._8_4_ = (uint)bVar9 * iVar56 | (uint)!bVar9 * auVar34._8_4_;
              bVar9 = (bool)((byte)(uVar24 >> 3) & 1);
              auVar53._12_4_ = (uint)bVar9 * iVar57 | (uint)!bVar9 * auVar34._12_4_;
              auVar53._16_4_ = (uint)((byte)(uVar24 >> 4) & 1) * iVar58;
              auVar53._20_4_ = (uint)((byte)(uVar24 >> 5) & 1) * iVar59;
              auVar53._24_4_ = (uint)((byte)(uVar24 >> 6) & 1) * iVar60;
              auVar53._28_4_ = (uint)(byte)(uVar24 >> 7) * iVar61;
              auVar54 = vrcp14ps_avx512vl(auVar51);
              auVar87._8_4_ = 0x3f800000;
              auVar87._0_8_ = 0x3f8000003f800000;
              auVar87._12_4_ = 0x3f800000;
              auVar87._16_4_ = 0x3f800000;
              auVar87._20_4_ = 0x3f800000;
              auVar87._24_4_ = 0x3f800000;
              auVar87._28_4_ = 0x3f800000;
              auVar36 = vfnmadd213ps_fma(auVar51,auVar54,auVar87);
              auVar36 = vfmadd132ps_fma(ZEXT1632(auVar36),auVar54,auVar54);
              auVar54 = vrcp14ps_avx512vl(auVar52);
              auVar32 = vfnmadd213ps_fma(auVar52,auVar54,auVar87);
              auVar32 = vfmadd132ps_fma(ZEXT1632(auVar32),auVar54,auVar54);
              auVar54 = vrcp14ps_avx512vl(auVar53);
              auVar34 = vfnmadd213ps_fma(auVar53,auVar54,auVar87);
              auVar18._4_4_ = uVar5;
              auVar18._0_4_ = uVar5;
              auVar18._8_4_ = uVar5;
              auVar18._12_4_ = uVar5;
              auVar18._16_4_ = uVar5;
              auVar18._20_4_ = uVar5;
              auVar18._24_4_ = uVar5;
              auVar18._28_4_ = uVar5;
              auVar35 = vfmadd213ps_fma(auVar49,auVar18,*(undefined1 (*) [32])(uVar23 + 0x160));
              auVar34 = vfmadd132ps_fma(ZEXT1632(auVar34),auVar54,auVar54);
              auVar19._4_4_ = uVar4;
              auVar19._0_4_ = uVar4;
              auVar19._8_4_ = uVar4;
              auVar19._12_4_ = uVar4;
              auVar19._16_4_ = uVar4;
              auVar19._20_4_ = uVar4;
              auVar19._24_4_ = uVar4;
              auVar19._28_4_ = uVar4;
              auVar33 = vfmadd231ps_fma(ZEXT1632(auVar35),auVar19,auVar45);
              auVar49._4_4_ = fVar66 * *(float *)(uVar23 + 0x1c4);
              auVar49._0_4_ = fVar66 * *(float *)(uVar23 + 0x1c0);
              auVar49._8_4_ = fVar66 * *(float *)(uVar23 + 0x1c8);
              auVar49._12_4_ = fVar66 * *(float *)(uVar23 + 0x1cc);
              auVar49._16_4_ = fVar66 * *(float *)(uVar23 + 0x1d0);
              auVar49._20_4_ = fVar66 * *(float *)(uVar23 + 0x1d4);
              auVar49._24_4_ = fVar66 * *(float *)(uVar23 + 0x1d8);
              auVar49._28_4_ = auVar45._28_4_;
              auVar35 = vfmadd213ps_fma(auVar7,auVar18,*(undefined1 (*) [32])(uVar23 + 0x180));
              auVar65 = vfmadd231ps_fma(ZEXT1632(auVar35),auVar19,
                                        *(undefined1 (*) [32])(uVar23 + 0xc0));
              auVar35 = vfmadd213ps_fma(auVar8,auVar18,*(undefined1 (*) [32])(uVar23 + 0x1a0));
              auVar35 = vfmadd231ps_fma(ZEXT1632(auVar35),auVar19,auVar48);
              auVar45._4_4_ = fVar66 * *(float *)(uVar23 + 0x1e4);
              auVar45._0_4_ = fVar66 * *(float *)(uVar23 + 0x1e0);
              auVar45._8_4_ = fVar66 * *(float *)(uVar23 + 0x1e8);
              auVar45._12_4_ = fVar66 * *(float *)(uVar23 + 0x1ec);
              auVar45._16_4_ = fVar66 * *(float *)(uVar23 + 0x1f0);
              auVar45._20_4_ = fVar66 * *(float *)(uVar23 + 500);
              auVar45._24_4_ = fVar66 * *(float *)(uVar23 + 0x1f8);
              auVar45._28_4_ = auVar48._28_4_;
              auVar7._4_4_ = uVar3;
              auVar7._0_4_ = uVar3;
              auVar7._8_4_ = uVar3;
              auVar7._12_4_ = uVar3;
              auVar7._16_4_ = uVar3;
              auVar7._20_4_ = uVar3;
              auVar7._24_4_ = uVar3;
              auVar7._28_4_ = uVar3;
              auVar33 = vfmadd231ps_fma(ZEXT1632(auVar33),auVar7,
                                        *(undefined1 (*) [32])(uVar23 + 0x40));
              auVar65 = vfmadd231ps_fma(ZEXT1632(auVar65),auVar7,auVar46);
              auVar48._4_4_ = fVar66 * *(float *)(uVar23 + 0x204);
              auVar48._0_4_ = fVar66 * *(float *)(uVar23 + 0x200);
              auVar48._8_4_ = fVar66 * *(float *)(uVar23 + 0x208);
              auVar48._12_4_ = fVar66 * *(float *)(uVar23 + 0x20c);
              auVar48._16_4_ = fVar66 * *(float *)(uVar23 + 0x210);
              auVar48._20_4_ = fVar66 * *(float *)(uVar23 + 0x214);
              auVar48._24_4_ = fVar66 * *(float *)(uVar23 + 0x218);
              auVar48._28_4_ = auVar46._28_4_;
              auVar67 = vfmadd231ps_fma(auVar49,auVar64,ZEXT832(0) << 0x20);
              auVar69 = vfmadd231ps_fma(auVar45,auVar64,ZEXT832(0) << 0x20);
              auVar73 = vfmadd231ps_fma(auVar48,auVar64,ZEXT832(0) << 0x20);
              auVar35 = vfmadd231ps_fma(ZEXT1632(auVar35),auVar7,auVar47);
              auVar70._0_4_ = auVar64._0_4_ + fVar66 * *(float *)(uVar23 + 0x220);
              auVar70._4_4_ = auVar64._0_4_ + fVar66 * *(float *)(uVar23 + 0x224);
              auVar70._8_4_ = auVar64._0_4_ + fVar66 * *(float *)(uVar23 + 0x228);
              auVar70._12_4_ = auVar64._0_4_ + fVar66 * *(float *)(uVar23 + 0x22c);
              auVar70._16_4_ = auVar64._0_4_ + fVar66 * *(float *)(uVar23 + 0x230);
              auVar70._20_4_ = auVar64._0_4_ + fVar66 * *(float *)(uVar23 + 0x234);
              auVar70._24_4_ = auVar64._0_4_ + fVar66 * *(float *)(uVar23 + 0x238);
              auVar70._28_4_ = auVar64._0_4_ + auVar47._28_4_;
              auVar46 = vsubps_avx(ZEXT1632(auVar67),ZEXT1632(auVar33));
              auVar47 = vsubps_avx(auVar70,ZEXT1632(auVar33));
              auVar71._0_4_ = auVar64._0_4_ + fVar66 * *(float *)(uVar23 + 0x240);
              auVar71._4_4_ = auVar64._0_4_ + fVar66 * *(float *)(uVar23 + 0x244);
              auVar71._8_4_ = auVar64._0_4_ + fVar66 * *(float *)(uVar23 + 0x248);
              auVar71._12_4_ = auVar64._0_4_ + fVar66 * *(float *)(uVar23 + 0x24c);
              auVar71._16_4_ = auVar64._0_4_ + fVar66 * *(float *)(uVar23 + 0x250);
              auVar71._20_4_ = auVar64._0_4_ + fVar66 * *(float *)(uVar23 + 0x254);
              auVar71._24_4_ = auVar64._0_4_ + fVar66 * *(float *)(uVar23 + 600);
              auVar71._28_4_ = auVar64._0_4_ + auVar70._28_4_;
              auVar45 = vsubps_avx(ZEXT1632(auVar69),ZEXT1632(auVar65));
              auVar48 = vsubps_avx(auVar71,ZEXT1632(auVar65));
              auVar72._0_4_ = auVar64._0_4_ + fVar66 * *(float *)(uVar23 + 0x260);
              auVar72._4_4_ = auVar64._0_4_ + fVar66 * *(float *)(uVar23 + 0x264);
              auVar72._8_4_ = auVar64._0_4_ + fVar66 * *(float *)(uVar23 + 0x268);
              auVar72._12_4_ = auVar64._0_4_ + fVar66 * *(float *)(uVar23 + 0x26c);
              auVar72._16_4_ = auVar64._0_4_ + fVar66 * *(float *)(uVar23 + 0x270);
              auVar72._20_4_ = auVar64._0_4_ + fVar66 * *(float *)(uVar23 + 0x274);
              auVar72._24_4_ = auVar64._0_4_ + fVar66 * *(float *)(uVar23 + 0x278);
              auVar72._28_4_ = auVar64._0_4_ + auVar71._28_4_;
              auVar49 = vsubps_avx(ZEXT1632(auVar73),ZEXT1632(auVar35));
              auVar7 = vsubps_avx(auVar72,ZEXT1632(auVar35));
              auVar8._4_4_ = auVar46._4_4_ * auVar36._4_4_;
              auVar8._0_4_ = auVar46._0_4_ * auVar36._0_4_;
              auVar8._8_4_ = auVar46._8_4_ * auVar36._8_4_;
              auVar8._12_4_ = auVar46._12_4_ * auVar36._12_4_;
              auVar8._16_4_ = auVar46._16_4_ * 0.0;
              auVar8._20_4_ = auVar46._20_4_ * 0.0;
              auVar8._24_4_ = auVar46._24_4_ * 0.0;
              auVar8._28_4_ = auVar72._28_4_;
              auVar50._4_4_ = auVar36._4_4_ * auVar47._4_4_;
              auVar50._0_4_ = auVar36._0_4_ * auVar47._0_4_;
              auVar50._8_4_ = auVar36._8_4_ * auVar47._8_4_;
              auVar50._12_4_ = auVar36._12_4_ * auVar47._12_4_;
              auVar50._16_4_ = auVar47._16_4_ * 0.0;
              auVar50._20_4_ = auVar47._20_4_ * 0.0;
              auVar50._24_4_ = auVar47._24_4_ * 0.0;
              auVar50._28_4_ = auVar47._28_4_;
              auVar76._0_4_ = auVar45._0_4_ * auVar32._0_4_;
              auVar76._4_4_ = auVar45._4_4_ * auVar32._4_4_;
              auVar76._8_4_ = auVar45._8_4_ * auVar32._8_4_;
              auVar76._12_4_ = auVar45._12_4_ * auVar32._12_4_;
              auVar76._16_4_ = auVar45._16_4_ * 0.0;
              auVar76._20_4_ = auVar45._20_4_ * 0.0;
              auVar76._24_4_ = auVar45._24_4_ * 0.0;
              auVar76._28_4_ = 0;
              auVar77 = ZEXT3264(auVar76);
              auVar14._4_4_ = auVar49._4_4_ * auVar34._4_4_;
              auVar14._0_4_ = auVar49._0_4_ * auVar34._0_4_;
              auVar14._8_4_ = auVar49._8_4_ * auVar34._8_4_;
              auVar14._12_4_ = auVar49._12_4_ * auVar34._12_4_;
              auVar14._16_4_ = auVar49._16_4_ * 0.0;
              auVar14._20_4_ = auVar49._20_4_ * 0.0;
              auVar14._24_4_ = auVar49._24_4_ * 0.0;
              auVar14._28_4_ = auVar49._28_4_;
              auVar15._4_4_ = auVar48._4_4_ * auVar32._4_4_;
              auVar15._0_4_ = auVar48._0_4_ * auVar32._0_4_;
              auVar15._8_4_ = auVar48._8_4_ * auVar32._8_4_;
              auVar15._12_4_ = auVar48._12_4_ * auVar32._12_4_;
              auVar15._16_4_ = auVar48._16_4_ * 0.0;
              auVar15._20_4_ = auVar48._20_4_ * 0.0;
              auVar15._24_4_ = auVar48._24_4_ * 0.0;
              auVar15._28_4_ = auVar48._28_4_;
              auVar16._4_4_ = auVar7._4_4_ * auVar34._4_4_;
              auVar16._0_4_ = auVar7._0_4_ * auVar34._0_4_;
              auVar16._8_4_ = auVar7._8_4_ * auVar34._8_4_;
              auVar16._12_4_ = auVar7._12_4_ * auVar34._12_4_;
              auVar16._16_4_ = auVar7._16_4_ * 0.0;
              auVar16._20_4_ = auVar7._20_4_ * 0.0;
              auVar16._24_4_ = auVar7._24_4_ * 0.0;
              auVar16._28_4_ = auVar7._28_4_;
              auVar46 = vpminsd_avx2(auVar76,auVar15);
              auVar47 = vpminsd_avx2(auVar14,auVar16);
              auVar46 = vmaxps_avx(auVar46,auVar47);
              auVar74 = ZEXT3264(auVar46);
              auVar49 = vpminsd_avx2(auVar8,auVar50);
              auVar45 = vpmaxsd_avx2(auVar8,auVar50);
              auVar47 = vpmaxsd_avx2(auVar76,auVar15);
              auVar48 = vpmaxsd_avx2(auVar14,auVar16);
              auVar47 = vminps_avx(auVar47,auVar48);
              auVar48 = vmaxps_avx512vl(auVar40,auVar49);
              auVar46 = vmaxps_avx(auVar48,auVar46);
              auVar45 = vminps_avx512vl(auVar41,auVar45);
              auVar47 = vminps_avx(auVar45,auVar47);
              uVar10 = vcmpps_avx512vl(auVar46,auVar47,2);
              uVar25 = (uint)uVar10;
            }
            else {
              auVar36 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar23 + 0x100 + uVar29),auVar63,
                                        *(undefined1 (*) [32])(uVar23 + 0x40 + uVar29));
              auVar45 = vfmadd213ps_avx512vl(ZEXT1632(auVar36),auVar37,auVar42);
              auVar36 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar23 + 0x100 + uVar30),auVar63,
                                        *(undefined1 (*) [32])(uVar23 + 0x40 + uVar30));
              auVar32 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar23 + 0x100 + uVar28),auVar63,
                                        *(undefined1 (*) [32])(uVar23 + 0x40 + uVar28));
              auVar46 = vfmadd213ps_avx512vl(ZEXT1632(auVar36),auVar38,auVar43);
              auVar47 = vfmadd213ps_avx512vl(ZEXT1632(auVar32),auVar39,auVar44);
              auVar36 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar23 + 0x100 + (uVar29 ^ 0x20)),
                                        auVar63,*(undefined1 (*) [32])
                                                 (uVar23 + 0x40 + (uVar29 ^ 0x20)));
              auVar46 = vmaxps_avx(auVar46,auVar47);
              auVar48 = vfmadd213ps_avx512vl(ZEXT1632(auVar36),auVar37,auVar42);
              auVar36 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar23 + 0x100 + (uVar30 ^ 0x20)),
                                        auVar63,*(undefined1 (*) [32])
                                                 (uVar23 + 0x40 + (uVar30 ^ 0x20)));
              auVar47 = vfmadd213ps_avx512vl(ZEXT1632(auVar36),auVar38,auVar43);
              auVar36 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar23 + 0x100 + (uVar28 ^ 0x20)),
                                        auVar63,*(undefined1 (*) [32])
                                                 (uVar23 + 0x40 + (uVar28 ^ 0x20)));
              auVar49 = vfmadd213ps_avx512vl(ZEXT1632(auVar36),auVar39,auVar44);
              auVar74 = ZEXT3264(auVar49);
              auVar47 = vminps_avx(auVar47,auVar49);
              auVar45 = vmaxps_avx512vl(auVar40,auVar45);
              auVar46 = vmaxps_avx(auVar45,auVar46);
              auVar45 = vminps_avx512vl(auVar41,auVar48);
              auVar47 = vminps_avx(auVar45,auVar47);
              if (uVar25 == 6) {
                uVar10 = vcmpps_avx512vl(auVar46,auVar47,2);
                uVar11 = vcmpps_avx512vl(auVar63,*(undefined1 (*) [32])(uVar23 + 0x1c0),0xd);
                uVar12 = vcmpps_avx512vl(auVar63,*(undefined1 (*) [32])(uVar23 + 0x1e0),1);
                uVar25 = (uint)uVar10 & (uint)uVar11 & (uint)uVar12;
              }
              else {
                uVar10 = vcmpps_avx512vl(auVar46,auVar47,2);
                uVar25 = (uint)uVar10;
              }
            }
            if ((byte)uVar25 == 0) goto LAB_01c53eb2;
            lVar13 = 0;
            for (uVar24 = (ulong)(byte)uVar25; (uVar24 & 1) == 0;
                uVar24 = uVar24 >> 1 | 0x8000000000000000) {
              lVar13 = lVar13 + 1;
            }
            uVar24 = *(ulong *)(uVar23 + lVar13 * 8);
            uVar25 = (uVar25 & 0xff) - 1 & uVar25 & 0xff;
            uVar26 = (ulong)uVar25;
          } while (uVar25 == 0);
          do {
            *puVar27 = uVar24;
            puVar27 = puVar27 + 1;
            lVar13 = 0;
            for (uVar24 = uVar26; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
              lVar13 = lVar13 + 1;
            }
            uVar26 = uVar26 - 1 & uVar26;
            uVar24 = *(ulong *)(uVar23 + lVar13 * 8);
          } while (uVar26 != 0);
        } while( true );
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }